

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O2

void duckdb_je_arena_dalloc_promoted(tsdn_t *tsdn,void *ptr,tcache_t *tcache,_Bool slow_path)

{
  pthread_mutex_t *ppVar1;
  ulong *puVar2;
  undefined8 *puVar3;
  undefined8 *puVar4;
  void *pvVar5;
  rtree_leaf_elm_t *prVar6;
  ulong uVar7;
  undefined8 uVar8;
  edata_t *peVar9;
  ulong uVar10;
  rtree_ctx_t *rtree_ctx;
  rtree_contents_t *__return_storage_ptr__;
  long lVar11;
  uintptr_t in_R8;
  bin_t *bin;
  rtree_t *rtree;
  ulong uVar12;
  rtree_ctx_t rtree_ctx_fallback;
  rtree_ctx_t rStack_368;
  void *pvStack_1e8;
  rtree_contents_t local_1b0;
  
  if (tsdn == (tsdn_t *)0x0) {
    rtree = (rtree_t *)&stack0xfffffffffffffe68;
    duckdb_je_rtree_ctx_data_init((rtree_ctx_t *)rtree);
  }
  else {
    rtree = (rtree_t *)&(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_rtree_ctx;
  }
  __return_storage_ptr__ = &local_1b0;
  rtree_read(__return_storage_ptr__,tsdn,rtree,(rtree_ctx_t *)ptr,in_R8);
  pvStack_1e8 = ptr;
  malloc_mutex_lock((tsdn_t *)__return_storage_ptr__,&((arena_t *)tsdn)->large_mtx);
  ppVar1 = (pthread_mutex_t *)((long)&(((arena_t *)tsdn)->large_mtx).field_0 + 0x48);
  do {
    peVar9 = (((arena_t *)tsdn)->large).head.qlh_first;
    if (peVar9 == (edata_t *)0x0) {
      (((arena_t *)tsdn)->large_mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(ppVar1);
      for (uVar12 = 0; uVar12 != 0x24; uVar12 = uVar12 + 1) {
        for (uVar10 = 0; uVar10 < duckdb_je_bin_infos[uVar12].n_shards; uVar10 = uVar10 + 1) {
          lVar11 = uVar10 << 8;
          if (uVar12 < duckdb_je_bin_info_nbatched_sizes) {
            lVar11 = uVar10 * 0x288;
          }
          bin = (bin_t *)((long)&((arena_t *)tsdn)->nthreads[0].repr +
                         lVar11 + (ulong)duckdb_je_arena_bin_offsets[uVar12]);
          malloc_mutex_lock((tsdn_t *)__return_storage_ptr__,(malloc_mutex_t *)bin);
          if (uVar12 < duckdb_je_bin_info_nbatched_sizes) {
            batcher_init((batcher_t *)(bin + 1),0x10);
          }
          peVar9 = bin->slabcur;
          if (peVar9 != (edata_t *)0x0) {
            bin->slabcur = (edata_t *)0x0;
            (bin->lock).field_0.field_0.locked.repr = false;
            pthread_mutex_unlock((pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x48));
            duckdb_je_arena_slab_dalloc((tsdn_t *)__return_storage_ptr__,(arena_t *)tsdn,peVar9);
            malloc_mutex_lock((tsdn_t *)__return_storage_ptr__,(malloc_mutex_t *)bin);
          }
          ppVar1 = (pthread_mutex_t *)((long)&(bin->lock).field_0 + 0x48);
          while (peVar9 = duckdb_je_edata_heap_remove_first(&bin->slabs_nonfull),
                peVar9 != (edata_t *)0x0) {
            (bin->lock).field_0.field_0.locked.repr = false;
            pthread_mutex_unlock(ppVar1);
            duckdb_je_arena_slab_dalloc((tsdn_t *)__return_storage_ptr__,(arena_t *)tsdn,peVar9);
            malloc_mutex_lock((tsdn_t *)__return_storage_ptr__,(malloc_mutex_t *)bin);
          }
          while (peVar9 = (bin->slabs_full).head.qlh_first, peVar9 != (edata_t *)0x0) {
            arena_bin_slabs_full_remove((arena_t *)tsdn,bin,peVar9);
            (bin->lock).field_0.field_0.locked.repr = false;
            pthread_mutex_unlock(ppVar1);
            duckdb_je_arena_slab_dalloc((tsdn_t *)__return_storage_ptr__,(arena_t *)tsdn,peVar9);
            malloc_mutex_lock((tsdn_t *)__return_storage_ptr__,(malloc_mutex_t *)bin);
          }
          (bin->stats).curregs = 0;
          (bin->stats).curslabs = 0;
          (bin->lock).field_0.field_0.locked.repr = false;
          pthread_mutex_unlock(ppVar1);
        }
      }
      duckdb_je_pa_shard_reset((tsdn_t *)__return_storage_ptr__,&((arena_t *)tsdn)->pa_shard);
      return;
    }
    pvVar5 = peVar9->e_addr;
    (((arena_t *)tsdn)->large_mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock(ppVar1);
    rtree_ctx = (rtree_ctx_t *)&__return_storage_ptr__[0x12].metadata;
    if (__return_storage_ptr__ == (rtree_contents_t *)0x0) {
      duckdb_je_rtree_ctx_data_init(&rStack_368);
      rtree_ctx = &rStack_368;
    }
    uVar10 = (ulong)pvVar5 & 0xffffffffc0000000;
    uVar12 = (ulong)(((uint)((ulong)pvVar5 >> 0x1e) & 0xf) << 4);
    puVar2 = (ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar12);
    uVar12 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + uVar12);
    if (uVar12 != uVar10) {
      if (rtree_ctx->l2_cache[0].leafkey == uVar10) {
        prVar6 = rtree_ctx->l2_cache[0].leaf;
        rtree_ctx->l2_cache[0].leafkey = uVar12;
        rtree_ctx->l2_cache[0].leaf = (rtree_leaf_elm_t *)puVar2[1];
        *puVar2 = uVar10;
        puVar2[1] = (ulong)prVar6;
      }
      else {
        for (lVar11 = 0x118; lVar11 != 0x188; lVar11 = lVar11 + 0x10) {
          if (*(ulong *)((long)rtree_ctx->cache + lVar11 + -8) == uVar10) {
            uVar7 = *(ulong *)((long)&rtree_ctx->cache[0].leafkey + lVar11);
            puVar3 = (undefined8 *)((long)rtree_ctx->cache + lVar11 + -0x18);
            uVar8 = puVar3[1];
            puVar4 = (undefined8 *)((long)rtree_ctx->cache + lVar11 + -8);
            *puVar4 = *puVar3;
            puVar4[1] = uVar8;
            *(ulong *)((long)rtree_ctx->cache + lVar11 + -0x18) = uVar12;
            *(ulong *)((long)(rtree_ctx->cache + -1) + lVar11) = puVar2[1];
            *puVar2 = uVar10;
            puVar2[1] = uVar7;
            goto LAB_01f8071f;
          }
        }
        duckdb_je_rtree_leaf_elm_lookup_hard
                  ((tsdn_t *)__return_storage_ptr__,&duckdb_je_arena_emap_global.rtree,rtree_ctx,
                   (ulong)pvVar5 & 0xfffffffffffff000,true,false);
      }
    }
LAB_01f8071f:
    duckdb_je_large_dalloc((tsdn_t *)__return_storage_ptr__,peVar9);
    malloc_mutex_lock((tsdn_t *)__return_storage_ptr__,&((arena_t *)tsdn)->large_mtx);
  } while( true );
}

Assistant:

void
arena_dalloc_promoted(tsdn_t *tsdn, void *ptr, tcache_t *tcache,
    bool slow_path) {
	edata_t *edata = emap_edata_lookup(tsdn, &arena_emap_global, ptr);
	arena_dalloc_promoted_impl(tsdn, ptr, tcache, slow_path, edata);
}